

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_constant.hpp
# Opt level: O2

ostream * viennamath::operator<<(ostream *stream,ct_constant<35L> *c)

{
  string local_30;
  
  ct_constant<35l>::str_abi_cxx11_(&local_30,c);
  std::operator<<(stream,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream,
                           ct_constant<value_> const & c)
  {
    stream << c.str();
    return stream;
  }